

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O3

bool __thiscall Box::intersect(Box *this,Ray *r,double *t)

{
  _func_int **pp_Var1;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  BoxTestCount = BoxTestCount + 1;
  pdVar3 = this->d2;
  dVar7 = INFINITY;
  dVar6 = -INFINITY;
  lVar4 = 0x22;
  do {
    dVar8 = *(double *)((long)this + lVar4 * 8 + -0x10);
    dVar10 = *(double *)((long)this + lVar4 * 8 + -8);
    pp_Var1 = (&(this->super_GeometricObject)._vptr_GeometricObject)[lVar4];
    dVar9 = (r->dir).z * (double)pp_Var1 + (r->dir).x * dVar8 + (r->dir).y * dVar10;
    dVar8 = (double)pp_Var1 * (r->org).z + dVar8 * (r->org).x + dVar10 * (r->org).y;
    if (dVar9 <= 0.01) {
      dVar10 = pdVar3[-3];
      lVar5 = 0x160;
      if (dVar9 < -0.01) goto LAB_001054b2;
      if ((dVar8 < dVar10) || (*pdVar3 <= dVar8 && dVar8 != *pdVar3)) goto LAB_0010552c;
    }
    else {
      dVar10 = *pdVar3;
      lVar5 = 0x148;
LAB_001054b2:
      dVar11 = -(*(double *)((long)pdVar3 + lVar5 + -0x160) + dVar8) / dVar9;
      if ((dVar11 < dVar7) && (dVar7 = dVar11, dVar11 < geom_threshold)) goto LAB_0010552c;
      dVar9 = -(dVar8 + dVar10) / dVar9;
      if (dVar9 <= dVar6) {
        dVar9 = dVar6;
      }
      dVar6 = dVar9;
      if (dVar7 < dVar6) goto LAB_0010552c;
    }
    pdVar3 = pdVar3 + 1;
    lVar4 = lVar4 + 3;
  } while (lVar4 != 0x2b);
  *t = dVar6;
  bVar2 = true;
  if (dVar6 <= geom_threshold) {
LAB_0010552c:
    BoxTestMisses = BoxTestMisses + 1;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Box::intersect(Ray& r, double& t)
{
    STAT(BoxTestCount++);

    double tNear = -INFINITY;
    double tFar  = INFINITY;
    double t1,t2;
    double vd,vo;
    int i;

    for( i = 0; i < 3; i++ )
    {
        vd = r.dir & n[i];
        vo = r.org & n[i];

        if( vd > EPS )
        {
            t1 = -(vo + d2[i]) / vd;
            t2 = -(vo + d1[i]) / vd;
        }
        else
        if(vd < -EPS)
        {
            t1 = -(vo + d1[i]) / vd;
            t2 = -(vo + d2[i]) / vd;
        }
        else // ray is parallel to slab
        {
            if( vo < d1[i] || vo > d2[i] )
            {
                STAT(BoxTestMisses++);
                return false;
            }
            else
                continue;
        }
        if( t1 > tNear )
            tNear = t1;
        if( t2 < tFar )
            if( (tFar = t2) < geom_threshold )
            {
                STAT(BoxTestMisses++);
                return false;
            }
        if( tNear > tFar )
        {
            STAT(BoxTestMisses++);
            return false;
        }
    }
    t = tNear;
    if( t > geom_threshold )
        return true;
    else
    {
        STAT(BoxTestMisses++);
        return false;
    }
}